

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

ssize_t __thiscall vox::XYZI::write(XYZI *this,int __fd,void *__buf,size_t __n)

{
  pointer __ptr;
  size_t sVar1;
  undefined4 in_register_00000034;
  FILE *__s;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  id = 0x495a5958;
  fwrite(&id,4,1,__s);
  contentSize = getSize(this);
  fwrite(&contentSize,4,1,__s);
  childSize = 0;
  fwrite(&childSize,4,1,__s);
  fwrite(this,4,1,__s);
  __ptr = (this->voxels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar1 = fwrite(__ptr,1,(long)(this->voxels).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)__ptr,__s);
  return sVar1;
}

Assistant:

void XYZI::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('X', 'Y', 'Z', 'I');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&numVoxels, sizeof(int32_t), 1, fp);
    fwrite(voxels.data(), sizeof(uint8_t), voxels.size(), fp);
}